

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.H
# Opt level: O1

void __thiscall Fl_Window::border(Fl_Window *this,int b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Window *pFVar4;
  Fl_Widget *pFVar5;
  uint uVar6;
  byte *pbVar7;
  Fl_X *pFVar8;
  int iVar9;
  int iVar10;
  ulong auStack_38 [5];
  
  uVar6 = (this->super_Fl_Group).super_Fl_Widget.flags_;
  if (b == 0) {
    if ((uVar6 & 8) != 0) {
      return;
    }
    uVar6 = uVar6 | 8;
  }
  else {
    if ((uVar6 & 8) == 0) {
      return;
    }
    uVar6 = uVar6 & 0xfffffff7;
  }
  (this->super_Fl_Group).super_Fl_Widget.flags_ = uVar6;
  pFVar8 = this->i;
  if (pFVar8 == (Fl_X *)0x0) {
    return;
  }
  while( true ) {
    pFVar4 = pFVar8->w;
    if ((pFVar4->super_Fl_Group).super_Fl_Widget.parent_ != (Fl_Group *)0x0) {
      return;
    }
    if (((pFVar4->super_Fl_Group).super_Fl_Widget.flags_ & 0x100) != 0) {
      return;
    }
    if (pFVar4->size_range_set != '\0') break;
    pFVar5 = (pFVar4->super_Fl_Group).resizable_;
    if (pFVar5 == (Fl_Widget *)0x0) {
      iVar1 = (pFVar4->super_Fl_Group).super_Fl_Widget.w_;
      iVar2 = (pFVar4->super_Fl_Group).super_Fl_Widget.h_;
      pFVar4->minw = iVar1;
      pFVar4->minh = iVar2;
      pFVar4->maxw = iVar1;
      pFVar4->maxh = iVar2;
      pFVar4->dw = 0;
      pFVar4->dh = 0;
    }
    else {
      iVar1 = pFVar5->w_;
      iVar2 = pFVar5->h_;
      iVar9 = 100;
      if (iVar1 < 100) {
        iVar9 = iVar1;
      }
      iVar10 = 100;
      if (iVar2 < 100) {
        iVar10 = iVar2;
      }
      iVar3 = (pFVar4->super_Fl_Group).super_Fl_Widget.h_;
      pFVar4->minw = (iVar9 - iVar1) + (pFVar4->super_Fl_Group).super_Fl_Widget.w_;
      pFVar4->minh = (iVar10 - iVar2) + iVar3;
      pFVar4->maxw = 0;
      pFVar4->maxh = 0;
      pFVar4->dw = 0;
      pFVar4->dh = 0;
    }
    pFVar4->aspect = 0;
    pFVar4->size_range_set = '\x01';
    pFVar8 = pFVar4->i;
    if (pFVar8 == (Fl_X *)0x0) {
      return;
    }
  }
  pbVar7 = (byte *)XAllocSizeHints();
  pFVar4 = pFVar8->w;
  *(int *)(pbVar7 + 0x18) = pFVar4->minw;
  *(int *)(pbVar7 + 0x1c) = pFVar4->minh;
  *(int *)(pbVar7 + 0x20) = pFVar4->maxw;
  *(int *)(pbVar7 + 0x24) = pFVar4->maxh;
  *(int *)(pbVar7 + 0x28) = pFVar4->dw;
  *(int *)(pbVar7 + 0x2c) = pFVar4->dh;
  pbVar7[0x48] = 10;
  pbVar7[0x49] = 0;
  pbVar7[0x4a] = 0;
  pbVar7[0x4b] = 0;
  auStack_38[0] = 0;
  auStack_38[3] = 0;
  auStack_38[4] = 0;
  auStack_38[1] = 1;
  auStack_38[2] = 1;
  iVar1 = *(int *)(pbVar7 + 0x18);
  iVar2 = *(int *)(pbVar7 + 0x20);
  if ((iVar1 == iVar2) && (*(int *)(pbVar7 + 0x1c) == *(int *)(pbVar7 + 0x24))) {
    pbVar7[0] = 0x30;
    pbVar7[1] = 2;
    pbVar7[2] = 0;
    pbVar7[3] = 0;
    pbVar7[4] = 0;
    pbVar7[5] = 0;
    pbVar7[6] = 0;
    pbVar7[7] = 0;
    auStack_38[0] = 1;
    auStack_38[1] = 0x13;
    goto LAB_001e4f1c;
  }
  pbVar7[0] = 0x10;
  pbVar7[1] = 2;
  pbVar7[2] = 0;
  pbVar7[3] = 0;
  pbVar7[4] = 0;
  pbVar7[5] = 0;
  pbVar7[6] = 0;
  pbVar7[7] = 0;
  if (iVar2 < iVar1) {
    if (*(int *)(pbVar7 + 0x1c) <= *(int *)(pbVar7 + 0x24)) {
      pbVar7[0] = 0x30;
      pbVar7[1] = 2;
      pbVar7[2] = 0;
      pbVar7[3] = 0;
      pbVar7[4] = 0;
      pbVar7[5] = 0;
      pbVar7[6] = 0;
      pbVar7[7] = 0;
      if (iVar2 < iVar1) {
        if (fl_workarea_xywh[0] < 0) {
          fl_init_workarea();
        }
        *(int *)(pbVar7 + 0x20) = fl_workarea_xywh[2];
      }
      goto LAB_001e4ebf;
    }
  }
  else {
    pbVar7[0] = 0x30;
    pbVar7[1] = 2;
    pbVar7[2] = 0;
    pbVar7[3] = 0;
    pbVar7[4] = 0;
    pbVar7[5] = 0;
    pbVar7[6] = 0;
    pbVar7[7] = 0;
LAB_001e4ebf:
    if (*(int *)(pbVar7 + 0x24) < *(int *)(pbVar7 + 0x1c)) {
      if (fl_workarea_xywh[0] < 0) {
        fl_init_workarea();
      }
      *(int *)(pbVar7 + 0x24) = fl_workarea_xywh[3];
    }
  }
  if ((*(int *)(pbVar7 + 0x28) != 0) && (*(int *)(pbVar7 + 0x2c) != 0)) {
    *pbVar7 = *pbVar7 | 0x40;
  }
  if (pFVar8->w->aspect != 0) {
    *(undefined4 *)(pbVar7 + 0x38) = *(undefined4 *)(pbVar7 + 0x18);
    *(undefined4 *)(pbVar7 + 0x30) = *(undefined4 *)(pbVar7 + 0x18);
    *(undefined4 *)(pbVar7 + 0x3c) = *(undefined4 *)(pbVar7 + 0x1c);
    *(undefined4 *)(pbVar7 + 0x34) = *(undefined4 *)(pbVar7 + 0x1c);
    *pbVar7 = *pbVar7 | 0x80;
  }
LAB_001e4f1c:
  pFVar4 = pFVar8->w;
  uVar6 = (pFVar4->super_Fl_Group).super_Fl_Widget.flags_;
  if ((uVar6 & 0x10) != 0) {
    *pbVar7 = *pbVar7 | 1;
    *(int *)(pbVar7 + 8) = (pFVar4->super_Fl_Group).super_Fl_Widget.x_;
    *(int *)(pbVar7 + 0xc) = (pFVar4->super_Fl_Group).super_Fl_Widget.y_;
  }
  if ((uVar6 & 8) != 0) {
    auStack_38[0] = auStack_38[0] | 2;
    auStack_38[2] = 0;
  }
  XSetWMNormalHints(fl_display,pFVar8->xid,pbVar7);
  XChangeProperty(fl_display,pFVar8->xid,fl_MOTIF_WM_HINTS,fl_MOTIF_WM_HINTS,0x20,0,auStack_38,5);
  XFree(pbVar7);
  return;
}

Assistant:

unsigned int flags() const {return flags_;}